

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PInt::ReadValue(PInt *this,FSerializer *ar,char *key,void *addr)

{
  bool bVar1;
  NumericValue val;
  NumericValue local_28;
  
  FSerializer::operator()(ar,key,&local_28);
  if (local_28.type == NM_invalid) {
    bVar1 = false;
  }
  else {
    if (local_28.type == NM_float) {
      local_28.field_1.signedval = (int64_t)local_28.field_1.floatval;
    }
    bVar1 = false;
    switch(*(undefined4 *)&this->field_0x24) {
    case 1:
      *(undefined1 *)addr = local_28.field_1.signedval._0_1_;
      break;
    case 2:
      *(undefined2 *)addr = local_28.field_1.signedval._0_2_;
      break;
    default:
      goto switchD_003940e9_caseD_3;
    case 4:
      *(undefined4 *)addr = local_28.field_1.signedval._0_4_;
      break;
    case 8:
      *(anon_union_8_3_1b0c0a0a_for_NumericValue_2 *)addr = local_28.field_1;
    }
    bVar1 = true;
  }
switchD_003940e9_caseD_3:
  return bVar1;
}

Assistant:

bool PInt::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	NumericValue val;

	ar(key, val);
	if (val.type == NumericValue::NM_invalid) return false;	// not found or usable
	if (val.type == NumericValue::NM_float) val.signedval = (int64_t)val.floatval;

	// No need to check the unsigned state here. Downcasting to smaller types will yield the same result for both.
	switch (Size)
	{
	case 1:
		*(uint8_t*)addr = (uint8_t)val.signedval;
		break;

	case 2:
		*(uint16_t*)addr = (uint16_t)val.signedval;
		break;

	case 4:
		*(uint32_t*)addr = (uint32_t)val.signedval;
		break;

	case 8:
		*(uint64_t*)addr = (uint64_t)val.signedval;
		break;

	default:
		return false;	// something invalid
	}

	return true;
}